

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::XMLLoader::load(FileName *fileName,AffineSpace3fa *space,SharedState *state)

{
  bool bVar1;
  XMLLoader *this;
  Node *in_RDI;
  XMLLoader loader;
  SharedState *in_stack_00000180;
  AffineSpace3fa *in_stack_00000188;
  FileName *in_stack_00000190;
  XMLLoader *in_stack_00000198;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffffde8;
  key_type *in_stack_fffffffffffffe28;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffffe30;
  string local_198 [224];
  _func_int **local_b8;
  key_type local_b0;
  _Self local_90 [3];
  string local_78 [32];
  _Self local_58 [5];
  mapped_type *local_30;
  _func_int ***local_20;
  _func_int ***local_10;
  XMLLoader *local_8;
  
  embree::FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffde8);
  local_58[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
       ::find(in_stack_fffffffffffffde8,(key_type *)0x3d906e);
  local_90[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
       ::end(in_stack_fffffffffffffde8);
  bVar1 = std::operator!=(local_58,local_90);
  std::__cxx11::string::~string(local_78);
  if (bVar1) {
    __k = &local_b0;
    embree::FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffde8);
    local_30 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
               ::operator[](in_stack_fffffffffffffe30,__k);
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_30->ptr;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    XMLLoader(in_stack_00000198,in_stack_00000190,in_stack_00000188,in_stack_00000180);
    embree::FileName::operator_cast_to_string((FileName *)in_stack_fffffffffffffde8);
    this = (XMLLoader *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
           ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_10 = &local_b8;
    local_8 = this;
    if (local_b8 != (_func_int **)0x0) {
      (**(code **)(*local_b8 + 0x10))();
    }
    if (*(Node **)&(this->path).filename != (Node *)0x0) {
      (*((*(Node **)&(this->path).filename)->super_RefCount)._vptr_RefCount[3])();
    }
    *(Node **)&(this->path).filename = (Node *)*local_10;
    std::__cxx11::string::~string(local_198);
    local_20 = &local_b8;
    (in_RDI->super_RefCount)._vptr_RefCount = local_b8;
    if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
      (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
    }
    ~XMLLoader(this);
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::load(const FileName& fileName, const AffineSpace3fa& space, SharedState& state)
  {
    if (state.sceneMap.find(fileName) != state.sceneMap.end())
      return state.sceneMap[fileName];

    XMLLoader loader(fileName,space,state);
    state.sceneMap[fileName] = loader.root;
    return loader.root;
  }